

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O3

bool OpenSSLWrapper::GetCertInformation
               (X509 *cert,string *strCommonName,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *vstrAltNames)

{
  size_type sVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  X509_NAME *a;
  long lVar6;
  ulong uVar7;
  undefined8 *puVar8;
  void *pvVar9;
  int *piVar10;
  long *plVar11;
  void *__src;
  size_t sVar12;
  undefined8 uVar13;
  size_type *psVar14;
  long *plVar15;
  undefined1 *__dest;
  _Alloc_hider _Var16;
  int iVar17;
  size_type sVar18;
  char *pcVar19;
  string caAddrClient;
  string servInfoClient;
  string strTmp_1;
  uchar *utf8;
  string caBuf;
  string strTmp;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_148;
  undefined8 local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  long *local_128;
  long local_120;
  long local_118;
  long lStack_110;
  value_type local_108;
  uchar *local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_e0;
  string *local_d8;
  long *local_d0;
  int local_c8;
  long local_c0 [2];
  value_type local_b0 [3];
  undefined1 local_38 [8];
  
  local_d0 = local_c0;
  local_e0 = vstrAltNames;
  std::__cxx11::string::_M_construct((ulong)&local_d0,'\0');
  a = X509_get_subject_name((X509 *)cert);
  X509_NAME_oneline(a,(char *)local_d0,local_c8);
  plVar11 = local_d0;
  pcVar19 = (char *)strCommonName->_M_string_length;
  strlen((char *)local_d0);
  std::__cxx11::string::_M_replace((ulong)strCommonName,0,pcVar19,(ulong)plVar11);
  lVar6 = std::__cxx11::string::find((char *)strCommonName,0x1347d8,0);
  if (lVar6 != -1) {
    std::__cxx11::string::erase((ulong)strCommonName,0);
    uVar7 = std::__cxx11::string::find((char *)strCommonName,0x1347dd,0);
    if (uVar7 != 0xffffffffffffffff) {
      if (strCommonName->_M_string_length < uVar7) {
        uVar13 = std::__throw_out_of_range_fmt
                           ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                            "basic_string::erase",uVar7);
        if (local_148 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar19) {
          operator_delete(local_148,local_138._M_allocated_capacity + 1);
        }
        if (local_128 != &local_118) {
          operator_delete(local_128,local_118 + 1);
        }
        if (local_d0 != local_c0) {
          operator_delete(local_d0,local_c0[0] + 1);
        }
        _Unwind_Resume(uVar13);
      }
      strCommonName->_M_string_length = uVar7;
      (strCommonName->_M_dataplus)._M_p[uVar7] = '\0';
    }
    pcVar19 = (strCommonName->_M_dataplus)._M_p;
    sVar1 = strCommonName->_M_string_length;
    if (sVar1 != 0) {
      sVar18 = 0;
      do {
        iVar3 = tolower((int)pcVar19[sVar18]);
        pcVar19[sVar18] = (char)iVar3;
        sVar18 = sVar18 + 1;
      } while (sVar1 != sVar18);
      pcVar19 = (strCommonName->_M_dataplus)._M_p;
    }
    if ((*pcVar19 == '*') && (pcVar19[1] == '.')) {
      std::__cxx11::string::substr((ulong)&local_128,(ulong)strCommonName);
      puVar8 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,0x1347df)
      ;
      psVar14 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_138._M_allocated_capacity = *psVar14;
        local_138._8_8_ = puVar8[3];
        local_148 = &local_138;
      }
      else {
        local_138._M_allocated_capacity = *psVar14;
        local_148 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar8;
      }
      local_140 = puVar8[1];
      *puVar8 = psVar14;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
      psVar14 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_b0[0].field_2._0_8_ = *psVar14;
        local_b0[0].field_2._8_8_ = puVar8[3];
        local_b0[0]._M_dataplus._M_p = (pointer)&local_b0[0].field_2;
      }
      else {
        local_b0[0].field_2._0_8_ = *psVar14;
        local_b0[0]._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_b0[0]._M_string_length = puVar8[1];
      *puVar8 = psVar14;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      std::__cxx11::string::operator=((string *)strCommonName,(string *)local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0[0]._M_dataplus._M_p != &local_b0[0].field_2) {
        operator_delete(local_b0[0]._M_dataplus._M_p,local_b0[0].field_2._M_allocated_capacity + 1);
      }
      if (local_148 != &local_138) {
        operator_delete(local_148,local_138._M_allocated_capacity + 1);
      }
      if (local_128 != &local_118) {
        operator_delete(local_128,local_118 + 1);
      }
    }
  }
  pvVar9 = X509_get_ext_d2i((X509 *)cert,0x55,(int *)0x0,(int *)0x0);
  if (pvVar9 != (void *)0x0) {
    iVar3 = OPENSSL_sk_num(pvVar9);
    if (0 < iVar3) {
      iVar17 = 0;
      local_d8 = strCommonName;
      do {
        piVar10 = (int *)OPENSSL_sk_value(pvVar9,iVar17);
        if (piVar10 == (int *)0x0) goto LAB_001213fe;
        if (*piVar10 == 7) {
          __src = (void *)ASN1_STRING_get0_data(*(undefined8 *)(piVar10 + 2));
          uVar5 = ASN1_STRING_length(*(ASN1_STRING **)(piVar10 + 2));
          if (__src == (void *)0x0) goto LAB_001213fe;
          local_b0[0]._M_dataplus._M_p._0_2_ = (ushort)(4 < (int)uVar5) * 8 + 2;
          if ((int)uVar5 < 5) {
            if (uVar5 != 0) {
              sVar12 = (size_t)(int)uVar5;
              __dest = (undefined1 *)((long)&local_b0[0]._M_dataplus._M_p + 4);
              goto LAB_00121195;
            }
          }
          else {
            sVar12 = (size_t)uVar5;
            __dest = local_38;
LAB_00121195:
            memmove(__dest,__src,sVar12);
          }
          local_148 = &local_138;
          std::__cxx11::string::_M_construct((ulong)&local_148,'/');
          local_128 = &local_118;
          std::__cxx11::string::_M_construct((ulong)&local_128,' ');
          iVar4 = getnameinfo((sockaddr *)local_b0,0x80,local_148->_M_local_buf,0x20,
                              (char *)local_128,0x20,3);
          paVar2 = local_148;
          if (iVar4 == 0) {
            local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
            if (local_148 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              lVar6 = 1;
            }
            else {
              sVar12 = strlen(local_148->_M_local_buf);
              lVar6 = sVar12 + (long)paVar2;
            }
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,paVar2,lVar6);
            sVar1 = local_108._M_string_length;
            _Var16._M_p = local_108._M_dataplus._M_p;
            if (local_108._M_string_length != 0) {
              sVar18 = 0;
              do {
                iVar4 = tolower((int)_Var16._M_p[sVar18]);
                _Var16._M_p[sVar18] = (char)iVar4;
                sVar18 = sVar18 + 1;
              } while (sVar1 != sVar18);
            }
            iVar4 = std::__cxx11::string::compare((string *)local_d8);
            if (iVar4 != 0) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(local_e0,&local_108);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p != &local_108.field_2) {
              operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if (local_128 != &local_118) {
            operator_delete(local_128,local_118 + 1);
          }
          uVar13 = local_138._M_allocated_capacity;
          _Var16._M_p = (pointer)local_148;
          if (local_148 != &local_138) {
LAB_001213f6:
            operator_delete(_Var16._M_p,uVar13 + 1);
          }
        }
        else if (*piVar10 == 2) {
          local_e8 = (uchar *)0x0;
          ASN1_STRING_to_UTF8(&local_e8,*(ASN1_STRING **)(piVar10 + 2));
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_b0,(char *)local_e8,(allocator<char> *)&local_148);
          sVar1 = local_b0[0]._M_string_length;
          _Var16._M_p = local_b0[0]._M_dataplus._M_p;
          if (local_b0[0]._M_string_length != 0) {
            sVar18 = 0;
            do {
              iVar4 = tolower((int)_Var16._M_p[sVar18]);
              _Var16._M_p[sVar18] = (char)iVar4;
              sVar18 = sVar18 + 1;
            } while (sVar1 != sVar18);
          }
          iVar4 = std::__cxx11::string::compare((string *)local_d8);
          if (iVar4 != 0) {
            if ((*local_b0[0]._M_dataplus._M_p == '*') && (local_b0[0]._M_dataplus._M_p[1] == '.'))
            {
              std::__cxx11::string::substr((ulong)&local_108,(ulong)local_b0);
              plVar11 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_108,0,(char *)0x0,0x1347df);
              plVar15 = plVar11 + 2;
              if ((long *)*plVar11 == plVar15) {
                local_118 = *plVar15;
                lStack_110 = plVar11[3];
                local_128 = &local_118;
              }
              else {
                local_118 = *plVar15;
                local_128 = (long *)*plVar11;
              }
              local_120 = plVar11[1];
              *plVar11 = (long)plVar15;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_128);
              psVar14 = puVar8 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar14) {
                local_138._M_allocated_capacity = *psVar14;
                local_138._8_8_ = puVar8[3];
                local_148 = &local_138;
              }
              else {
                local_138._M_allocated_capacity = *psVar14;
                local_148 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)*puVar8;
              }
              local_140 = puVar8[1];
              *puVar8 = psVar14;
              puVar8[1] = 0;
              *(undefined1 *)(puVar8 + 2) = 0;
              std::__cxx11::string::operator=((string *)local_b0,(string *)&local_148);
              if (local_148 != &local_138) {
                operator_delete(local_148,local_138._M_allocated_capacity + 1);
              }
              if (local_128 != &local_118) {
                operator_delete(local_128,local_118 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p != &local_108.field_2) {
                operator_delete(local_108._M_dataplus._M_p,
                                local_108.field_2._M_allocated_capacity + 1);
              }
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(local_e0,local_b0);
          }
          if (local_e8 != (uchar *)0x0) {
            CRYPTO_free(local_e8);
          }
          uVar13 = local_b0[0].field_2._M_allocated_capacity;
          _Var16._M_p = local_b0[0]._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0[0]._M_dataplus._M_p != &local_b0[0].field_2) goto LAB_001213f6;
        }
LAB_001213fe:
        iVar17 = iVar17 + 1;
      } while (iVar17 != iVar3);
    }
    OPENSSL_sk_pop_free(pvVar9,GENERAL_NAME_free);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  return true;
}

Assistant:

bool GetCertInformation(const X509* cert, string& strCommonName, vector<string>& vstrAltNames)
    {
        string caBuf(256, 0);
        X509_NAME_oneline(X509_get_subject_name(cert), &caBuf[0], static_cast<int>(caBuf.size()));

        strCommonName = &caBuf[0];
        size_t nPos = strCommonName.find("/CN=");
        if (nPos != string::npos)
        {
            strCommonName.erase(0, nPos + 4);
            nPos = strCommonName.find("/");
            if (nPos != string::npos)
                strCommonName.erase(nPos, string::npos);
            transform(begin(strCommonName), end(strCommonName), begin(strCommonName), [](char c) noexcept { return static_cast<char>(::tolower(c)); });

            if (strCommonName[0] == '*' && strCommonName[1] == '.')
                strCommonName = "^(.+\\.)?" + strCommonName.substr(2) + "$";
        }

        STACK_OF(GENERAL_NAME)* pSubAltNames = static_cast<STACK_OF(GENERAL_NAME)*>(X509_get_ext_d2i(cert, NID_subject_alt_name, nullptr, nullptr));
        if (pSubAltNames != nullptr)
        {
            const int iCountNames = sk_GENERAL_NAME_num(pSubAltNames);
            for (int i = 0; i < iCountNames; ++i)
            {
                const GENERAL_NAME* entry = sk_GENERAL_NAME_value(pSubAltNames, i);
                if (!entry) continue;

                if (entry->type == GEN_DNS)
                {
                    unsigned char* utf8 = nullptr;
                    ASN1_STRING_to_UTF8(&utf8, entry->d.dNSName);

                    string strTmp(reinterpret_cast<char*>(utf8));
                    transform(begin(strTmp), end(strTmp), begin(strTmp), [](char c) noexcept { return static_cast<char>(::tolower(c)); });
                    if (strCommonName.compare(strTmp) != 0)
                    {
                        if (strTmp[0] == '*' && strTmp[1] == '.')
                            strTmp = "^(.+\\.)?" + strTmp.substr(2) + "$";
                        vstrAltNames.push_back(strTmp);
                    }
                    if (utf8)
                        OPENSSL_free(utf8);
                }
                else if (entry->type == GEN_IPADD)
                {
                    const uint8_t* szIp = ASN1_STRING_get0_data(entry->d.iPAddress);
                    const int iStrLen = ASN1_STRING_length(entry->d.iPAddress);
                    if (szIp != nullptr)
                    {
                        struct sockaddr_storage addr;
                        addr.ss_family = iStrLen > 4 ? AF_INET6 : AF_INET;
                        if (iStrLen > 4)
                            copy(&szIp[0], &szIp[iStrLen], reinterpret_cast<uint8_t*>(&addr.__ss_align));
                        else
                            copy(&szIp[0], &szIp[iStrLen], reinterpret_cast<uint8_t*>(&addr.ss_family) + 4);
                        string caAddrClient(INET6_ADDRSTRLEN + 1, 0);
                        string servInfoClient(NI_MAXSERV, 0);
                        if (::getnameinfo(reinterpret_cast<struct sockaddr*>(&addr), sizeof(struct sockaddr_storage), &caAddrClient[0], sizeof(caAddrClient), &servInfoClient[0], NI_MAXSERV, NI_NUMERICHOST | NI_NUMERICSERV) == 0)
                        {
                            string strTmp(&caAddrClient[0]);
                            transform(begin(strTmp), end(strTmp), begin(strTmp), [](char c) noexcept { return static_cast<char>(::tolower(c)); });
                            if (strCommonName.compare(strTmp) != 0)
                                vstrAltNames.push_back(strTmp);
                        }
                    }
                }
            }

            sk_GENERAL_NAME_pop_free(pSubAltNames, GENERAL_NAME_free);
        }

        return true;
    }